

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

string * __thiscall
cmGeneratorExpressionEvaluationFile::GetInputFileName_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          cmLocalGenerator *lg)

{
  bool bVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  bVar1 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&sStack_38,__return_storage_ptr__);
  }
  else {
    FixRelativePath(&sStack_38,this,__return_storage_ptr__,PathForInput,lg);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::GetInputFileName(
  cmLocalGenerator* lg)
{
  std::string inputFileName = this->Input;

  if (cmSystemTools::FileIsFullPath(inputFileName)) {
    inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
  } else {
    inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
  }

  return inputFileName;
}